

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

void __thiscall
Assimp::StreamReader<true,_true>::IncPtr(StreamReader<true,_true> *this,intptr_t plus)

{
  int8_t *piVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  piVar1 = this->current;
  this->current = piVar1 + plus;
  if (piVar1 + plus <= this->limit) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"End of file or read limit was reached","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IncPtr(intptr_t plus)    {
        current += plus;
        if (current > limit) {
            throw DeadlyImportError("End of file or read limit was reached");
        }
    }